

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O3

int write_code(char *s,char *t)

{
  char cVar1;
  included *this;
  id *piVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  FILE *pFVar6;
  FILE *pFVar7;
  long lVar8;
  Fl_Type *pFVar9;
  char cVar10;
  char *pcVar11;
  char *pcVar12;
  Fl_Type *p;
  Fl_Type *pFVar13;
  char define_name [102];
  char local_98;
  char local_97 [103];
  
  piVar2 = id_root;
  pcVar12 = &local_98;
  pcVar11 = "wb";
  if (write_sourceview == 0) {
    pcVar11 = "w";
  }
  write_number = write_number + 1;
  if (id_root != (id *)0x0) {
    id::~id(id_root);
  }
  operator_delete(piVar2,0x20);
  uVar4 = 0;
  id_root = (id *)0x0;
  indentation = 0;
  current_class = (Fl_Class_Type *)0x0;
  current_widget_class = (Fl_Widget_Class_Type *)0x0;
  pFVar6 = _stdout;
  if ((s == (char *)0x0) || (pFVar6 = fl_fopen(s,pcVar11), pFVar6 != (FILE *)0x0)) {
    pFVar7 = _stdout;
    code_file = pFVar6;
    if ((t == (char *)0x0) || (pFVar7 = fl_fopen(t,pcVar11), pFVar7 != (FILE *)0x0)) {
      pFVar9 = Fl_Type::first;
      header_file = pFVar7;
      if (Fl_Type::first == (Fl_Type *)0x0) {
        pFVar9 = (Fl_Type *)0x0;
      }
      else {
        iVar3 = (*Fl_Type::first->_vptr_Fl_Type[0x25])(Fl_Type::first);
        if (iVar3 != 0) {
          if (write_sourceview != 0) {
            lVar8 = ftell((FILE *)code_file);
            pFVar9->code_position = (int)lVar8;
            lVar8 = ftell((FILE *)header_file);
            pFVar9->header_position = (int)lVar8;
          }
          (*pFVar9->_vptr_Fl_Type[0x11])(pFVar9);
          if (write_sourceview != 0) {
            lVar8 = ftell((FILE *)code_file);
            pFVar9->code_position_end = (int)lVar8;
            lVar8 = ftell((FILE *)header_file);
            pFVar9->header_position_end = (int)lVar8;
          }
          pFVar9 = pFVar9->next;
        }
      }
      fprintf((FILE *)header_file,
              "// generated by Fast Light User Interface Designer (fluid) version %.4f\n\n",
              0x3ff07c84b5dcc63f);
      fprintf((FILE *)code_file,
              "// generated by Fast Light User Interface Designer (fluid) version %.4f\n\n",
              0x3ff07c84b5dcc63f);
      pcVar11 = fl_filename_name(t);
      cVar1 = *pcVar11;
      iVar3 = isalpha((int)cVar1);
      if (iVar3 == 0) {
        pcVar12 = local_97;
        local_98 = '_';
        cVar1 = *pcVar11;
      }
      while (cVar1 != '\0') {
        pcVar11 = pcVar11 + 1;
        iVar3 = isalnum((int)cVar1);
        cVar10 = '_';
        if (iVar3 != 0) {
          cVar10 = cVar1;
        }
        *pcVar12 = cVar10;
        pcVar12 = pcVar12 + 1;
        cVar1 = *pcVar11;
      }
      *pcVar12 = '\0';
      fprintf((FILE *)header_file,"#ifndef %s\n",&local_98);
      fprintf((FILE *)header_file,"#define %s\n",&local_98);
      write_declare("#include <FL/Fl.H>");
      if ((i18n_type != 0) && (cVar1 = *i18n_include, cVar1 != '\0')) {
        if ((cVar1 == '<') || (cVar1 == '\"')) {
          pcVar12 = "#include %s\n";
        }
        else {
          pcVar12 = "#include \"%s\"\n";
        }
        write_c(pcVar12);
        if (i18n_type == 2) {
          if (*i18n_file == '\0') {
            write_c("// Initialize I18N stuff now for menus...\n");
            write_c("#include <locale.h>\n");
            write_c("static char *_locale = setlocale(LC_MESSAGES, \"\");\n");
            pcVar11 = "static nl_catd _catalog = catopen(\"%s\", 0);\n";
            pcVar12 = i18n_program;
          }
          else {
            pcVar11 = "extern nl_catd %s;\n";
            pcVar12 = i18n_file;
          }
          write_c(pcVar11,pcVar12);
        }
      }
      this = included_root;
      if ((t != (char *)0x0) && (include_H_from_C != 0)) {
        if ((*header_file_name == '.') &&
           (pcVar12 = strchr(header_file_name,0x2f), pcVar12 == (char *)0x0)) {
          t = fl_filename_name(t);
        }
        write_c("#include \"%s\"\n",t);
        this = included_root;
      }
      while (included_root = this, pFVar9 != (Fl_Type *)0x0) {
        if (write_sourceview != 0) {
          lVar8 = ftell((FILE *)header_file);
          pFVar9->header_position = (int)lVar8;
        }
        (*pFVar9->_vptr_Fl_Type[0x10])(pFVar9);
        if (write_sourceview != 0) {
          lVar8 = ftell((FILE *)header_file);
          iVar3 = (int)lVar8;
          if (pFVar9->header_position == iVar3) {
            iVar3 = -1;
          }
          pFVar9->header_position_end = iVar3;
        }
        for (pFVar13 = pFVar9->next; (pFVar13 != (Fl_Type *)0x0 && (pFVar9->level < pFVar13->level))
            ; pFVar13 = pFVar13->next) {
          if (write_sourceview != 0) {
            lVar8 = ftell((FILE *)header_file);
            pFVar13->header_position = (int)lVar8;
          }
          (*pFVar13->_vptr_Fl_Type[0x10])(pFVar13);
          if (write_sourceview != 0) {
            lVar8 = ftell((FILE *)header_file);
            iVar3 = (int)lVar8;
            if (pFVar13->header_position == iVar3) {
              iVar3 = -1;
            }
            pFVar13->header_position_end = iVar3;
          }
        }
        pFVar9 = write_code(pFVar9);
        this = included_root;
      }
      if (this != (included *)0x0) {
        included::~included(this);
      }
      operator_delete(this,0x18);
      included_root = (included *)0x0;
      if (s == (char *)0x0) {
        uVar4 = 1;
      }
      else {
        fwrite("#endif\n",7,1,(FILE *)header_file);
        pFVar9 = Fl_Type::last;
        if ((Fl_Type::last != (Fl_Type *)0x0) &&
           (iVar3 = (*Fl_Type::last->_vptr_Fl_Type[0x25])(Fl_Type::last), iVar3 != 0)) {
          if (write_sourceview != 0) {
            lVar8 = ftell((FILE *)code_file);
            pFVar9->code_position = (int)lVar8;
            lVar8 = ftell((FILE *)header_file);
            pFVar9->header_position = (int)lVar8;
          }
          (*pFVar9->_vptr_Fl_Type[0x11])(pFVar9);
          if (write_sourceview != 0) {
            lVar8 = ftell((FILE *)code_file);
            pFVar9->code_position_end = (int)lVar8;
            lVar8 = ftell((FILE *)header_file);
            pFVar9->header_position_end = (int)lVar8;
          }
        }
        uVar4 = fclose((FILE *)code_file);
        code_file = (FILE *)0x0;
        uVar5 = fclose((FILE *)header_file);
        header_file = (FILE *)0x0;
        uVar4 = ~(uVar5 | uVar4) >> 0x1f;
      }
    }
    else {
      fclose((FILE *)code_file);
    }
  }
  return uVar4;
}

Assistant:

int write_code(const char *s, const char *t) {
  const char *filemode = "w";
  if (write_sourceview) 
    filemode = "wb";
  write_number++;
  delete id_root; id_root = 0;
  indentation = 0;
  current_class = 0L;
  current_widget_class = 0L;
  if (!s) code_file = stdout;
  else {
    FILE *f = fl_fopen(s, filemode);
    if (!f) return 0;
    code_file = f;
  }
  if (!t) header_file = stdout;
  else {
    FILE *f = fl_fopen(t, filemode);
    if (!f) {fclose(code_file); return 0;}
    header_file = f;
  }
  // if the first entry in the Type tree is a comment, then it is probably 
  // a copyright notice. We print that before anything else in the file!
  Fl_Type* first_type = Fl_Type::first;
  if (first_type && first_type->is_comment()) {
    if (write_sourceview) {
      first_type->code_position = (int)ftell(code_file);
      first_type->header_position = (int)ftell(header_file);
    }
    // it is ok to write non-recusive code here, because comments have no children or code2 blocks
    first_type->write_code1();
    if (write_sourceview) {
      first_type->code_position_end = (int)ftell(code_file);
      first_type->header_position_end = (int)ftell(header_file);
    }
    first_type = first_type->next;
  }

  const char *hdr = "\
// generated by Fast Light User Interface Designer (fluid) version %.4f\n\n";
  fprintf(header_file, hdr, FL_VERSION);
  fprintf(code_file, hdr, FL_VERSION);

  {char define_name[102];
  const char* a = fl_filename_name(t);
  char* b = define_name;
  if (!isalpha(*a)) {*b++ = '_';}
  while (*a) {*b++ = isalnum(*a) ? *a : '_'; a++;}
  *b = 0;
  fprintf(header_file, "#ifndef %s\n", define_name);
  fprintf(header_file, "#define %s\n", define_name);
  }  

  write_declare("#include <FL/Fl.H>");
  if (i18n_type && i18n_include[0]) {
    if (i18n_include[0] != '<' &&
        i18n_include[0] != '\"')
      write_c("#include \"%s\"\n", i18n_include);
    else
      write_c("#include %s\n", i18n_include);
    if (i18n_type == 2) {
      if (i18n_file[0]) write_c("extern nl_catd %s;\n", i18n_file);
      else {
        write_c("// Initialize I18N stuff now for menus...\n");
        write_c("#include <locale.h>\n");
	write_c("static char *_locale = setlocale(LC_MESSAGES, \"\");\n");
        write_c("static nl_catd _catalog = catopen(\"%s\", 0);\n",
                   i18n_program);
      }
    }
  }
  if (t && include_H_from_C) {
    if (*header_file_name == '.' && strchr(header_file_name, '/') == NULL) {
      write_c("#include \"%s\"\n", fl_filename_name(t));
    } else {
      write_c("#include \"%s\"\n", t);
    }
  }
  for (Fl_Type* p = first_type; p;) {
    // write all static data for this & all children first
    if (write_sourceview) p->header_position = (int)ftell(header_file);
    p->write_static();
    if (write_sourceview) {
      p->header_position_end = (int)ftell(header_file);
      if (p->header_position==p->header_position_end) p->header_position_end = -1;
    }
    for (Fl_Type* q = p->next; q && q->level > p->level; q = q->next) {
      if (write_sourceview) q->header_position = (int)ftell(header_file);
      q->write_static();
      if (write_sourceview) {
        q->header_position_end = (int)ftell(header_file);
        if (q->header_position==q->header_position_end) q->header_position_end = -1;
      }
    }
    // then write the nested code:
    p = write_code(p);
  }

  delete included_root; included_root = 0;

  if (!s) return 1;

  fprintf(header_file, "#endif\n");

  Fl_Type* last_type = Fl_Type::last;
  if (last_type && last_type->is_comment()) {
    if (write_sourceview) {
      last_type->code_position = (int)ftell(code_file);
      last_type->header_position = (int)ftell(header_file);
    }
    last_type->write_code1();
    if (write_sourceview) {
      last_type->code_position_end = (int)ftell(code_file);
      last_type->header_position_end = (int)ftell(header_file);
    }
  }

  int x = fclose(code_file);
  code_file = 0;
  int y = fclose(header_file);
  header_file = 0;
  return x >= 0 && y >= 0;
}